

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapImpl.h
# Opt level: O0

void MoveIn(Heap *heap,Chuck *chuck)

{
  byte bVar1;
  Size SVar2;
  Size SVar3;
  Chuck *local_38;
  uint8_t slot_1;
  uint8_t slot;
  Chuck *fit;
  Chuck *chuck_local;
  Heap *heap_local;
  
  if (heap->head == (Chuck *)0x0) {
    SetPrev(chuck,(Chuck *)0x0);
    SetNext(chuck,(Chuck *)0x0);
  }
  else {
    SVar2 = GetSize(chuck);
    local_38 = FindSmallestFitInHeap(heap,SVar2);
    if (local_38 == (Chuck *)0x0) {
      local_38 = heap->last;
    }
    Insert(local_38,chuck);
  }
  if (heap->head == (Chuck *)0x0) {
    if (heap->last != (Chuck *)0x0) {
      __assert_fail("!heap->last",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/HeapImpl.h"
                    ,0xf5,"void MoveIn(Heap *, Chuck *)");
    }
    heap->last = chuck;
    heap->head = chuck;
  }
  else {
    if (chuck == heap->head->prev) {
      heap->head = chuck;
    }
    if (chuck == heap->last->next) {
      heap->last = chuck;
    }
  }
  SVar2 = GetSize(chuck);
  if (SVar2 < 0x218) {
    SVar2 = GetSize(chuck);
    bVar1 = MatchExact(SVar2);
    if (heap->exact[bVar1] == (Chuck *)0x0) {
      heap->exact[bVar1] = chuck;
    }
  }
  else {
    SVar2 = GetSize(chuck);
    bVar1 = MatchSorted(SVar2);
    if (heap->sorted[bVar1] != (Chuck *)0x0) {
      SVar2 = GetSize(chuck);
      SVar3 = GetSize(heap->sorted[bVar1]);
      if (SVar3 <= SVar2) {
        return;
      }
    }
    heap->sorted[bVar1] = chuck;
  }
  return;
}

Assistant:

static void MoveIn(Heap *heap, Chuck *chuck) {
    if (heap->head) {
        Chuck *fit = FindSmallestFitInHeap(heap, GetSize(chuck));
        Insert(fit ? fit : heap->last, chuck);
    } else {
        SetPrev(chuck, NULL);
        SetNext(chuck, NULL);
    }

    if (!heap->head) {
        assert(!heap->last);
        heap->head = heap->last = chuck;
    } else {
        if (chuck == heap->head->prev) {
            heap->head = chuck;
        }
        if (chuck == heap->last->next) {
            heap->last = chuck;
        }
    }

    if (GetSize(chuck) < NOT_EXACT_MIN) {
        uint8_t slot = MatchExact(GetSize(chuck));
        if (!heap->exact[slot]) {
            heap->exact[slot] = chuck;
        }
    } else {
        uint8_t slot = MatchSorted(GetSize(chuck));
        if (!heap->sorted[slot] ||
            GetSize(chuck) < GetSize(heap->sorted[slot])) {
            heap->sorted[slot] = chuck;
        }
    }
}